

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  byte bVar1;
  int iVar2;
  ImGuiSortDirection IVar3;
  
  if (column->SortOrder == -1) {
    IVar3 = column->SortDirectionsAvailList;
LAB_00186490:
    IVar3 = IVar3 & (ImGuiSortDirection_Descending|ImGuiSortDirection_Ascending);
  }
  else {
    bVar1 = 1;
    for (iVar2 = 0; iVar2 != 6; iVar2 = iVar2 + 2) {
      if (((column->SortDirectionsAvailList >> ((byte)iVar2 & 0x1f) ^ column->field_0x6d) & 3) == 0)
      {
        IVar3 = column->SortDirectionsAvailList >>
                (bVar1 % ((byte)column->field_0x6d >> 2 & 3)) * '\x02';
        goto LAB_00186490;
      }
      bVar1 = bVar1 + 1;
    }
    IVar3 = ImGuiSortDirection_None;
  }
  return IVar3;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}